

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FeatureSet::ByteSizeLong(FeatureSet *this)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar3 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  bVar1 = *(byte *)((long)&this->field_0 + 0x18);
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      uVar4 = (long)(this->field_0)._impl_.field_presence_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 2) != 0) {
      uVar4 = (long)(this->field_0)._impl_.enum_type_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 4) != 0) {
      uVar4 = (long)(this->field_0)._impl_.repeated_field_encoding_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 8) != 0) {
      uVar4 = (long)(this->field_0)._impl_.utf8_validation_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 0x10) != 0) {
      uVar4 = (long)(this->field_0)._impl_.message_encoding_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 0x20) != 0) {
      uVar4 = (long)(this->field_0)._impl_.json_format_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 0x40) != 0) {
      uVar4 = (long)(this->field_0)._impl_.enforce_naming_style_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((char)bVar1 < '\0') {
      uVar4 = (long)(this->field_0)._impl_.default_symbol_visibility_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t FeatureSet::ByteSizeLong() const {
  const FeatureSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FeatureSet)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional .google.protobuf.FeatureSet.FieldPresence field_presence = 1 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_field_presence());
    }
    // optional .google.protobuf.FeatureSet.EnumType enum_type = 2 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_type());
    }
    // optional .google.protobuf.FeatureSet.RepeatedFieldEncoding repeated_field_encoding = 3 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_field_encoding());
    }
    // optional .google.protobuf.FeatureSet.Utf8Validation utf8_validation = 4 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_utf8_validation());
    }
    // optional .google.protobuf.FeatureSet.MessageEncoding message_encoding = 5 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_message_encoding());
    }
    // optional .google.protobuf.FeatureSet.JsonFormat json_format = 6 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_json_format());
    }
    // optional .google.protobuf.FeatureSet.EnforceNamingStyle enforce_naming_style = 7 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_EXTENSION_RANGE, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_ONEOF, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_ENUM_ENTRY, targets = TARGET_TYPE_SERVICE, targets = TARGET_TYPE_METHOD, edition_defaults = {
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enforce_naming_style());
    }
    // optional .google.protobuf.FeatureSet.VisibilityFeature.DefaultSymbolVisibility default_symbol_visibility = 8 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, edition_defaults = {
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_symbol_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}